

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool Fossilize::merge_concurrent_databases_last_use
               (char *append_archive,char **source_paths,size_t num_source_paths,
               bool skip_missing_inputs)

{
  pointer puVar1;
  int iVar2;
  long lVar3;
  DatabaseInterface *pDVar4;
  mapped_type *pmVar5;
  __node_base_ptr *pp_Var6;
  size_t sVar7;
  ulong uVar8;
  bool bVar9;
  unsigned_long *hash;
  pointer __k;
  uint i;
  size_t sVar10;
  ResourceTag tag;
  char *path;
  ulong uVar11;
  __node_base *p_Var12;
  size_t hash_count;
  uint64_t timestamp;
  size_t timestamp_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  timestamps [10];
  size_type local_2b8;
  size_t local_2b0;
  ulong local_2a8;
  long local_2a0;
  size_t local_298;
  char *local_290;
  char **local_288;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_280;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_268 [10];
  
  lVar3 = 0x230;
  pp_Var6 = &local_268[0]._M_single_bucket;
  do {
    ((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      *)(pp_Var6 + -6))->_M_buckets = pp_Var6;
    pp_Var6[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var6 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var6[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var6 + -2))->_M_max_load_factor = 1.0;
    pp_Var6[-1] = (__node_base_ptr)0x0;
    *pp_Var6 = (__node_base_ptr)0x0;
    pp_Var6 = pp_Var6 + 7;
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != 0);
  local_288 = source_paths;
  if (num_source_paths != 0xffffffffffffffff) {
    sVar7 = 0;
    local_298 = num_source_paths;
    local_290 = append_archive;
    do {
      path = local_290;
      if (sVar7 != 0) {
        path = local_288[sVar7 - 1];
      }
      local_2b0 = sVar7;
      pDVar4 = create_stream_archive_database(path,ReadOnly);
      iVar2 = (*pDVar4->_vptr_DatabaseInterface[2])(pDVar4);
      sVar10 = local_2b0;
      if ((char)iVar2 == '\0') {
        if (local_2b0 != 0 && skip_missing_inputs) {
          fprintf(_stderr,"Fossilize WARN: Archive %s could not be prepared, skipping.\n",path);
          goto LAB_00147291;
        }
        (*pDVar4->_vptr_DatabaseInterface[1])(pDVar4);
        if (sVar10 != 0) {
          bVar9 = false;
          goto LAB_0014736d;
        }
      }
      else {
        uVar11 = 0;
        do {
          local_2b8 = 0;
          iVar2 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,uVar11 & 0xffffffff,&local_2b8,0);
          if ((char)iVar2 == '\0') goto LAB_00147362;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_280,local_2b8,(allocator_type *)&local_2a0);
          iVar2 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,uVar11 & 0xffffffff,&local_2b8);
          puVar1 = local_280.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if ((char)iVar2 == '\0') {
            bVar9 = false;
          }
          else if (local_280.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start ==
                   local_280.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
            bVar9 = true;
          }
          else {
            __k = local_280.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
            do {
              local_2a0 = 8;
              local_2a8 = 0;
              iVar2 = (*pDVar4->_vptr_DatabaseInterface[3])
                                (pDVar4,uVar11 & 0xffffffff,*__k,(allocator_type *)&local_2a0,
                                 &local_2a8,0);
              if (((char)iVar2 == '\0') || (local_2a0 != 8)) {
                bVar9 = false;
                goto LAB_00147266;
              }
              pmVar5 = std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)(local_268 + uVar11),__k);
              uVar8 = local_2a8;
              if (local_2a8 < *pmVar5) {
                uVar8 = *pmVar5;
              }
              *pmVar5 = uVar8;
              __k = __k + 1;
            } while (__k != puVar1);
            bVar9 = true;
          }
LAB_00147266:
          if (local_280.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (key_type *)0x0) {
            operator_delete(local_280.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_280.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_280.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar9) goto LAB_00147362;
          uVar11 = uVar11 + 1;
        } while (uVar11 != 10);
LAB_00147291:
        (*pDVar4->_vptr_DatabaseInterface[1])(pDVar4);
        sVar10 = local_2b0;
      }
      sVar7 = sVar10 + 1;
      append_archive = local_290;
    } while (sVar10 != local_298);
  }
  pDVar4 = create_stream_archive_database(append_archive,OverWrite);
  iVar2 = (*pDVar4->_vptr_DatabaseInterface[2])(pDVar4);
  if ((char)iVar2 == '\0') {
LAB_00147362:
    bVar9 = false;
  }
  else {
    uVar11 = 0;
    do {
      p_Var12 = &local_268[uVar11]._M_before_begin;
      while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
        iVar2 = (*pDVar4->_vptr_DatabaseInterface[4])
                          (pDVar4,uVar11 & 0xffffffff,p_Var12[1]._M_nxt,
                           (_Prime_rehash_policy *)(p_Var12 + 2),8,8);
        if ((char)iVar2 == '\0') goto LAB_00147362;
      }
      uVar11 = uVar11 + 1;
      bVar9 = true;
    } while (uVar11 != 10);
  }
  (*pDVar4->_vptr_DatabaseInterface[1])(pDVar4);
LAB_0014736d:
  lVar3 = 0x1f8;
  do {
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((long)&local_268[0]._M_buckets + lVar3));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x38);
  return bVar9;
}

Assistant:

bool merge_concurrent_databases_last_use(const char *append_archive, const char * const *source_paths, size_t num_source_paths,
                                         bool skip_missing_inputs)
{
	std::unordered_map<Hash, uint64_t> timestamps[RESOURCE_COUNT];

	for (size_t source = 0; source < num_source_paths + 1; source++)
	{
		const char *path = source ? source_paths[source - 1] : append_archive;
		auto source_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(path, DatabaseMode::ReadOnly));
		if (!source_db->prepare())
		{
			if (source == 0)
				continue;
			else
			{
				if (!skip_missing_inputs)
					return false;

				LOGW("Archive %s could not be prepared, skipping.\n", path);
				continue;
			}
		}

		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = static_cast<ResourceTag>(i);

			size_t hash_count = 0;
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return false;
			std::vector<Hash> hashes(hash_count);
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
				return false;

			for (auto &hash : hashes)
			{
				size_t timestamp_size = sizeof(uint64_t);
				uint64_t timestamp = 0;
				if (!source_db->read_entry(tag, hash, &timestamp_size, &timestamp, PAYLOAD_READ_NO_FLAGS) ||
				    timestamp_size != sizeof(uint64_t))
					return false;

				auto &entry = timestamps[i][hash];
				entry = std::max<uint64_t>(entry, timestamp);
			}
		}
	}

	auto write_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(append_archive, DatabaseMode::OverWrite));
	if (!write_db->prepare())
		return false;

	for (unsigned i = 0; i < RESOURCE_COUNT; i++)
	{
		auto tag = static_cast<ResourceTag>(i);
		auto &ts = timestamps[i];

		for (auto &t : ts)
			if (!write_db->write_entry(tag, t.first, &t.second, sizeof(t.second), PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT))
				return false;
	}

	return true;
}